

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O0

string * __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::print_abi_cxx11_
          (tag_no_value_t<cfgfile::string_trait_t> *this,int indent)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  reference pptVar5;
  int in_EDX;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  char cVar6;
  string *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range4;
  string_t *result;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  *in_stack_fffffffffffffef0;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_ffffffffffffff00;
  allocator *paVar7;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff08;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  tag_t<cfgfile::string_trait_t> *local_70;
  tag_t<cfgfile::string_trait_t> **local_68;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_60;
  undefined8 local_58;
  allocator local_49;
  string local_48 [51];
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string(in_RDI);
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_ffffffffffffff08);
  cVar6 = const_t<cfgfile::string_trait_t>::c_tab;
  if (bVar2) {
    uVar4 = (ulong)local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,uVar4,cVar6,&local_49);
    std::__cxx11::string::append(in_RDI);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    cVar6 = (char)in_RDI;
    std::__cxx11::string::push_back(cVar6);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RSI);
    std::__cxx11::string::append(in_RDI);
    (*in_RSI->_vptr_tag_t[2])();
    bVar2 = std::
            vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ::empty(in_stack_ffffffffffffff00);
    if (!bVar2) {
      std::__cxx11::string::push_back(cVar6);
      iVar3 = (*in_RSI->_vptr_tag_t[2])();
      local_58 = CONCAT44(extraout_var,iVar3);
      local_60._M_current =
           (tag_t<cfgfile::string_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
           ::begin(in_stack_fffffffffffffee8);
      local_68 = (tag_t<cfgfile::string_trait_t> **)
                 std::
                 vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                 ::end(in_stack_fffffffffffffee8);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffef0,
                                (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffee8),
            cVar1 = const_t<cfgfile::string_trait_t>::c_tab, bVar2) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::operator*(&local_60);
        local_70 = *pptVar5;
        (*local_70->_vptr_tag_t[3])(local_90,local_70,(ulong)(local_14 + 1));
        std::__cxx11::string::append(in_RDI);
        std::__cxx11::string::~string(local_90);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::operator++(&local_60);
      }
      uVar4 = (ulong)local_14;
      paVar7 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,uVar4,cVar1,paVar7);
      std::__cxx11::string::append(in_RDI);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}